

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void dfs_range2(int head,int cur,int len)

{
  int iVar1;
  iterator __position;
  long lVar2;
  iterator iVar3;
  vector<int,std::allocator<int>> *this;
  mapped_type *this_00;
  ulong uVar4;
  int (*paiVar5) [60];
  long lVar6;
  long lVar7;
  int *__k;
  vector<int,_std::allocator<int>_> a;
  int local_74;
  ulong local_70;
  int local_64;
  int local_60;
  int local_5c;
  vector<int,_std::allocator<int>_> local_58;
  long local_38;
  
  lVar2 = (long)cur;
  vis[lVar2] = true;
  if (0 < inDegrees[lVar2]) {
    uVar4 = (ulong)(uint)len;
    local_5c = head + 100;
    local_64 = -100 - head;
    local_60 = len + 1;
    paiVar5 = Ginv;
    lVar7 = 0;
    lVar6 = (long)head * 0x38;
    local_74 = cur;
    local_70 = uVar4;
    local_38 = lVar6;
    do {
      iVar1 = *(int *)((long)paiVar5 + lVar2 * 0x3c * 4);
      if ((head <= iVar1) && (vis[iVar1] == false)) {
        __k = (int *)((long)paiVar5 + lVar2 * 0x3c * 4);
        isValid[iVar1] = local_5c;
        if ((int)uVar4 == 2) {
          isTail[iVar1] = local_64;
          iVar3 = std::
                  _Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find((_Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          *)((long)&((pre.
                                      super__Vector_base<std::unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_h)._M_buckets +
                            lVar6),__k);
          if (iVar3.
              super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
              ._M_cur == (__node_type *)0x0) {
            local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)0x0;
            local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)0x0;
            local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)operator_new(4);
            local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + 1;
            *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start = local_74;
            local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage =
                 local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            this_00 = std::__detail::
                      _Map_base<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)((long)&((pre.
                                                super__Vector_base<std::unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->_M_h).
                                              _M_buckets + lVar6),__k);
            std::vector<int,_std::allocator<int>_>::operator=(this_00,&local_58);
            uVar4 = local_70;
            if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (int *)0x0) {
              operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
          }
          else {
            this = (vector<int,std::allocator<int>> *)
                   std::__detail::
                   _Map_base<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)((long)&((pre.
                                             super__Vector_base<std::unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->_M_h).
                                           _M_buckets + lVar6),__k);
            __position._M_current = *(int **)(this + 8);
            if (__position._M_current == *(int **)(this + 0x10)) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (this,__position,&local_74);
              uVar4 = local_70;
            }
            else {
              *__position._M_current = local_74;
              *(int **)(this + 8) = __position._M_current + 1;
              uVar4 = local_70;
            }
          }
        }
        else if (2 < (int)uVar4) goto LAB_001029e7;
        dfs_range2(head,*__k,local_60);
        lVar6 = local_38;
      }
LAB_001029e7:
      lVar7 = lVar7 + 1;
      lVar2 = (long)local_74;
      paiVar5 = (int (*) [60])((long)paiVar5 + 4);
    } while (lVar7 < inDegrees[lVar2]);
  }
  vis[lVar2] = false;
  return;
}

Assistant:

void dfs_range2(int head, int cur, int len) {
    vis[cur] = true;
    for (int i = 0; i < inDegrees[cur]; ++i) {
        int &v = Ginv[cur][i];
        if (v < head || vis[v])continue;
        isValid[v] = head + 100;
        if (len == 2) {
            isTail[v] = -100 - head;
            if (pre[head].find(v) == pre[head].end()) {
                vector<int> a(1, cur);
                pre[head][v] = a;
            } else {
                pre[head][v].push_back(cur);
            }
        }
        if (len >= 3)continue;
        dfs_range2(head, v, len + 1);
    }
    vis[cur] = false;
}